

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUnreach.c
# Opt level: O0

DdNode * Abc_NtkTransitionRelation(DdManager *dd,Abc_Ntk_t *pNtk,int fVerbose)

{
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Abc_Obj_t *pAVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  int local_58;
  int i;
  int fReorder;
  Abc_Obj_t *pNode;
  DdNode *bInputs;
  DdNode *bVar;
  DdNode *bProd;
  DdNode *bTemp;
  DdNode *bRel;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  DdManager *dd_local;
  
  iVar3 = dd->size;
  iVar2 = Abc_NtkCiNum(pNtk);
  if (iVar3 == iVar2) {
    iVar3 = Abc_NtkCiNum(pNtk);
    iVar2 = Abc_NtkLatchNum(pNtk);
    Cudd_bddIthVar(dd,iVar3 + iVar2 + -1);
    Cudd_AutodynEnable(dd,CUDD_REORDER_SYMM_SIFT);
    bTemp = dd->one;
    Cudd_Ref(bTemp);
    for (local_58 = 0; iVar3 = Vec_PtrSize(pNtk->vBoxes), local_58 < iVar3; local_58 = local_58 + 1)
    {
      pAVar5 = Abc_NtkBox(pNtk,local_58);
      iVar3 = Abc_ObjIsLatch(pAVar5);
      if (iVar3 != 0) {
        iVar3 = Abc_NtkCiNum(pNtk);
        pDVar6 = Cudd_bddIthVar(dd,iVar3 + local_58);
        pAVar5 = Abc_ObjFanin0(pAVar5);
        pDVar7 = (DdNode *)Abc_ObjGlobalBdd(pAVar5);
        pDVar6 = Cudd_bddXnor(dd,pDVar6,pDVar7);
        Cudd_Ref(pDVar6);
        pDVar7 = Cudd_bddAnd(dd,bTemp,pDVar6);
        Cudd_Ref(pDVar7);
        Cudd_RecursiveDeref(dd,bTemp);
        Cudd_RecursiveDeref(dd,pDVar6);
        bTemp = pDVar7;
      }
    }
    Abc_NtkFreeGlobalBdds(pNtk,0);
    iVar3 = Abc_NtkPiNum(pNtk);
    pDVar6 = Extra_bddComputeRangeCube(dd,0,iVar3);
    Cudd_Ref(pDVar6);
    pDVar7 = Cudd_bddExistAbstract(dd,bTemp,pDVar6);
    Cudd_Ref(pDVar7);
    Cudd_RecursiveDeref(dd,bTemp);
    Cudd_RecursiveDeref(dd,pDVar6);
    pFVar1 = _stdout;
    if (fVerbose != 0) {
      uVar4 = Cudd_DagSize(pDVar7);
      fprintf(pFVar1,"BDD nodes in the transition relation before reordering %d.\n",(ulong)uVar4);
    }
    Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,100);
    Cudd_AutodynDisable(dd);
    pFVar1 = _stdout;
    if (fVerbose != 0) {
      uVar4 = Cudd_DagSize(pDVar7);
      fprintf(pFVar1,"BDD nodes in the transition relation after reordering %d.\n",(ulong)uVar4);
    }
    Cudd_Deref(pDVar7);
    return pDVar7;
  }
  __assert_fail("dd->size == Abc_NtkCiNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcUnreach.c"
                ,0x87,"DdNode *Abc_NtkTransitionRelation(DdManager *, Abc_Ntk_t *, int)");
}

Assistant:

DdNode * Abc_NtkTransitionRelation( DdManager * dd, Abc_Ntk_t * pNtk, int fVerbose )
{
    DdNode * bRel, * bTemp, * bProd, * bVar, * bInputs;
    Abc_Obj_t * pNode;
    int fReorder = 1;
    int i;

    // extand the BDD manager to represent NS variables
    assert( dd->size == Abc_NtkCiNum(pNtk) );
    Cudd_bddIthVar( dd, Abc_NtkCiNum(pNtk) + Abc_NtkLatchNum(pNtk) - 1 );

    // enable reordering
    if ( fReorder )
        Cudd_AutodynEnable( dd, CUDD_REORDER_SYMM_SIFT );
    else
        Cudd_AutodynDisable( dd );

    // compute the transition relation
    bRel = b1;   Cudd_Ref( bRel );
    Abc_NtkForEachLatch( pNtk, pNode, i )
    {
        bVar  = Cudd_bddIthVar( dd, Abc_NtkCiNum(pNtk) + i );
//        bProd = Cudd_bddXnor( dd, bVar, pNtk->vFuncsGlob->pArray[i] );  Cudd_Ref( bProd );
        bProd = Cudd_bddXnor( dd, bVar, (DdNode *)Abc_ObjGlobalBdd(Abc_ObjFanin0(pNode)) );  Cudd_Ref( bProd );
        bRel  = Cudd_bddAnd( dd, bTemp = bRel, bProd );                 Cudd_Ref( bRel );
        Cudd_RecursiveDeref( dd, bTemp ); 
        Cudd_RecursiveDeref( dd, bProd ); 
    }
    // free the global BDDs
//    Abc_NtkFreeGlobalBdds( pNtk );
    Abc_NtkFreeGlobalBdds( pNtk, 0 );

    // quantify the PI variables
    bInputs = Extra_bddComputeRangeCube( dd, 0, Abc_NtkPiNum(pNtk) );    Cudd_Ref( bInputs );
    bRel    = Cudd_bddExistAbstract( dd, bTemp = bRel, bInputs );    Cudd_Ref( bRel );
    Cudd_RecursiveDeref( dd, bTemp ); 
    Cudd_RecursiveDeref( dd, bInputs ); 

    // reorder and disable reordering
    if ( fReorder )
    {
        if ( fVerbose )
            fprintf( stdout, "BDD nodes in the transition relation before reordering %d.\n", Cudd_DagSize(bRel) );
        Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
        Cudd_AutodynDisable( dd );
        if ( fVerbose )
            fprintf( stdout, "BDD nodes in the transition relation after reordering %d.\n", Cudd_DagSize(bRel) );
    }
    Cudd_Deref( bRel );
    return bRel;
}